

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O2

void __thiscall
QHttpNetworkConnectionChannel::pipelineInto
          (QHttpNetworkConnectionChannel *this,HttpMessagePair *pair)

{
  QHttpNetworkReply *pQVar1;
  long lVar2;
  ProxyType PVar3;
  QHttpNetworkRequestPrivate *pQVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = pair->second;
  QHttpNetworkReplyPrivate::clear(*(QHttpNetworkReplyPrivate **)&pQVar1->field_0x8);
  QWeakPointer<QObject>::operator=
            ((QWeakPointer<QObject> *)(*(long *)&pQVar1->field_0x8 + 0x168),
             (QWeakPointer<QObject> *)(this + 0xf0));
  QWeakPointer<QObject>::assign<QObject>
            ((QWeakPointer<QObject> *)(*(long *)&pQVar1->field_0x8 + 0x178),(QObject *)this);
  pQVar4 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&(pair->first).d);
  lVar2 = *(long *)&pQVar1->field_0x8;
  *(bool *)(lVar2 + 0x18c) = pQVar4->autoDecompress;
  *(undefined1 *)(lVar2 + 0x1b9) = 1;
  PVar3 = QNetworkProxy::type((QNetworkProxy *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xc0));
  QHttpNetworkRequestPrivate::header((QByteArray *)&local_40,&pair->first,PVar3 != NoProxy);
  QByteArray::append((QByteArray *)(this + 0xd0));
  QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
  QList<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
  emplaceBack<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>const&>
            ((QList<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *)(this + 0xb8),pair);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::pipelineInto(HttpMessagePair &pair)
{
    // this is only called for simple GET

    QHttpNetworkRequest &request = pair.first;
    QHttpNetworkReply *reply = pair.second;
    reply->d_func()->clear();
    reply->d_func()->connection = connection;
    reply->d_func()->connectionChannel = this;
    reply->d_func()->autoDecompress = request.d->autoDecompress;
    reply->d_func()->pipeliningUsed = true;

#ifndef QT_NO_NETWORKPROXY
    pipeline.append(QHttpNetworkRequestPrivate::header(request,
                                                           (connection->d_func()->networkProxy.type() != QNetworkProxy::NoProxy)));
#else
    pipeline.append(QHttpNetworkRequestPrivate::header(request, false));
#endif

    alreadyPipelinedRequests.append(pair);

    // pipelineFlush() needs to be called at some point afterwards
}